

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_get_global_tx_alloc(wally_psbt *psbt,wally_tx **output)

{
  int iVar1;
  
  iVar1 = -2;
  if ((output != (wally_tx **)0x0) && (*output = (wally_tx *)0x0, psbt != (wally_psbt *)0x0)) {
    if (psbt->tx != (wally_tx *)0x0) {
      iVar1 = wally_tx_clone_alloc(psbt->tx,0,output);
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_psbt_get_global_tx_alloc(const struct wally_psbt *psbt, struct wally_tx **output)
{
    TX_CHECK_OUTPUT;
    if (!psbt)
        return WALLY_EINVAL;
    if (!psbt->tx)
        return WALLY_OK; /* Return a NULL tx if not present */
    return tx_clone_alloc(psbt->tx, output);
}